

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::HandleBadFullItem
          (cmComputeLinkInformation *this,LinkEntry *entry,string *file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmake *pcVar3;
  cmState *this_00;
  undefined8 this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  PolicyStatus PVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  ostream *poVar7;
  string *psVar8;
  PolicyID id;
  PolicyID id_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string wid;
  ostringstream e;
  string local_298;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_220 [16];
  undefined1 local_210 [56];
  _Rb_tree_color _Stack_1d8;
  undefined4 uStack_1d4;
  _Rb_tree_color local_1d0;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  element_type *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_180;
  ios_base local_138 [264];
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((this->Depends).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->Depends).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,entry);
  if (__position._M_current !=
      (this->Depends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&this->Depends,(iterator)__position._M_current);
  }
  local_210._0_8_ = local_210 + 0x10;
  pcVar2 = (entry->Item).Value._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_210,pcVar2,pcVar2 + (entry->Item).Value._M_string_length);
  local_210._32_8_ =
       (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_210._40_8_ =
       (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._40_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._40_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._40_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._40_8_)->_M_use_count + 1;
    }
  }
  local_1d0 = entry->Kind;
  local_210._48_4_ = *(undefined4 *)&entry->Target;
  local_210._52_4_ = *(undefined4 *)((long)&entry->Target + 4);
  _Stack_1d8 = *(_Rb_tree_color *)&entry->ObjectSource;
  uStack_1d4 = *(undefined4 *)((long)&entry->ObjectSource + 4);
  local_1c8._M_p = (pointer)&local_1b8;
  pcVar2 = (entry->Feature)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar2,pcVar2 + (entry->Feature)._M_string_length);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_268 + 0x20);
  pcVar2 = (file->_M_dataplus)._M_p;
  local_258._M_allocated_capacity = (size_type)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_268 + 0x10),pcVar2,pcVar2 + file->_M_string_length);
  local_238._M_allocated_capacity = 0;
  local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_allocated_capacity == paVar1) {
    local_198._8_8_ = local_248._8_8_;
    local_1a8._0_8_ = &local_198;
  }
  else {
    local_1a8._0_8_ = local_258._M_allocated_capacity;
  }
  local_198._M_allocated_capacity._1_7_ = local_248._M_allocated_capacity._1_7_;
  local_198._M_local_buf[0] = local_248._M_local_buf[0];
  local_1a8._8_8_ = local_258._8_8_;
  local_258._8_8_ = 0;
  local_248._M_local_buf[0] = '\0';
  local_188 = (element_type *)local_238._M_allocated_capacity;
  p_Stack_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_;
  local_238._M_allocated_capacity = 0;
  local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_258._M_allocated_capacity = (size_type)paVar1;
  std::__cxx11::string::operator=((string *)local_210,(string *)local_1a8);
  p_Var4 = p_Stack_180;
  local_210._32_8_ = local_188;
  this_01 = local_210._40_8_;
  local_188 = (element_type *)0x0;
  p_Stack_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_210._40_8_ = p_Var4;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    if (p_Stack_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_180);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_allocated_capacity != paVar1) {
    operator_delete((void *)local_258._M_allocated_capacity,
                    CONCAT71(local_248._M_allocated_capacity._1_7_,local_248._M_local_buf[0]) + 1);
  }
  AddUserItem(this,(LinkEntry *)local_210,false);
  cmOrderDirectories::AddLinkLibrary
            ((this->OrderLinkerSearchPath)._M_t.
             super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
             super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,(string *)entry);
  PVar6 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0008);
  if (PVar6 - REQUIRED_IF_USED < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_298,(cmPolicies *)0x8,id);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\nTarget \"",9);
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" links to item\n  ",0x12);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(entry->Item).Value._M_dataplus._M_p,
                        (entry->Item).Value._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\nwhich is a full-path but not a valid library file name.",0x38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_278);
    cmake::IssueMessage(pcVar3,FATAL_ERROR,&local_298,(cmListFileBacktrace *)local_278);
    if ((cmMakefile *)local_278._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else if (PVar6 == WARN) {
    local_1a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x16;
    local_1a8._8_8_ = "CMP0008-WARNING-GIVEN-";
    local_198._M_allocated_capacity = 0;
    local_188 = (element_type *)(entry->Item).Value._M_dataplus._M_p;
    local_198._8_8_ = (entry->Item).Value._M_string_length;
    p_Stack_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    views._M_len = 2;
    views._M_array = (iterator)local_1a8;
    cmCatViews(&local_298,views);
    bVar5 = cmState::GetGlobalPropertyAsBool
                      ((this->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_298);
    if (!bVar5) {
      this_00 = (this->CMakeInstance->State)._M_t.
                super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      local_1a8._0_8_ = &local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"1","");
      cmState::SetGlobalProperty(this_00,&local_298,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_278,(cmPolicies *)0x8,id_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_278._0_8_,local_278._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\nTarget \"",9);
      psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" links to item\n  ",0x12);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(entry->Item).Value._M_dataplus._M_p,
                          (entry->Item).Value._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\nwhich is a full-path but not a valid library file name.",0x38);
      if ((element_type *)local_278._0_8_ != (element_type *)local_268) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
      }
      pcVar3 = this->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_220);
      cmake::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_278,(cmListFileBacktrace *)local_220
                         );
      if ((_Base_ptr)local_220._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_);
      }
      if ((element_type *)local_278._0_8_ != (element_type *)local_268) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._40_8_);
  }
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::HandleBadFullItem(LinkEntry const& entry,
                                                 std::string const& file)
{
  std::string const& item = entry.Item.Value;
  // Do not depend on things that do not exist.
  auto i = std::find(this->Depends.begin(), this->Depends.end(), item);
  if (i != this->Depends.end()) {
    this->Depends.erase(i);
  }

  // Tell the linker to search for the item and provide the proper
  // path for it.  Do not contribute to any CMP0003 warning (do not
  // put in OldLinkDirItems or OldUserFlagItems).
  LinkEntry fileEntry{ entry };
  fileEntry.Item = file;
  this->AddUserItem(fileEntry, false);
  this->OrderLinkerSearchPath->AddLinkLibrary(item);

  // Produce any needed message.
  switch (this->Target->GetPolicyStatusCMP0008()) {
    case cmPolicies::WARN: {
      // Print the warning at most once for this item.
      std::string wid = cmStrCat("CMP0008-WARNING-GIVEN-", item);
      if (!this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(wid)) {
        this->CMakeInstance->GetState()->SetGlobalProperty(wid, "1");
        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0008) << "\n"
             "Target \"" << this->Target->GetName() << "\" links to item\n"
             "  " << item << "\n"
             "which is a full-path but not a valid library file name.";
        /* clang-format on */
        this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                          this->Target->GetBacktrace());
      }
    }
      CM_FALLTHROUGH;
    case cmPolicies::OLD: // NOLINT(bugprone-branch-clone)
      // OLD behavior does not warn.
      break;
    case cmPolicies::NEW:
      // NEW behavior will not get here.
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS: {
      std::ostringstream e;
      /* clang-format off */
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0008) << "\n"
             "Target \"" << this->Target->GetName() << "\" links to item\n"
             "  " << item << "\n"
             "which is a full-path but not a valid library file name.";
      /* clang-format on */
      this->CMakeInstance->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                        this->Target->GetBacktrace());
    } break;
  }
}